

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_ogf_v3.cxx
# Opt level: O2

void __thiscall xray_re::xr_ogf_v3::bone_io::import(bone_io *this,xr_reader *r)

{
  uint8_t *puVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  
  xr_reader::r_sz(r,&(this->super_xr_bone).m_name);
  xr_reader::r_sz(r,&(this->super_xr_bone).m_parent_name);
  std::__cxx11::string::_M_assign((string *)&(this->super_xr_bone).m_vmap_name);
  (this->super_xr_bone).m_shape.type = 1;
  (this->super_xr_bone).m_shape.flags = 0;
  puVar1 = (r->field_2).m_p;
  uVar2 = *(undefined8 *)puVar1;
  uVar3 = *(undefined8 *)(puVar1 + 8);
  uVar4 = *(undefined8 *)(puVar1 + 0x10);
  uVar5 = *(undefined8 *)(puVar1 + 0x18);
  uVar6 = *(undefined8 *)(puVar1 + 0x20);
  uVar7 = *(undefined8 *)(puVar1 + 0x28);
  uVar8 = *(undefined8 *)(puVar1 + 0x34);
  *(undefined8 *)((long)&(this->super_xr_bone).m_shape.box.translate.field_0 + 8) =
       *(undefined8 *)(puVar1 + 0x2c);
  *(undefined8 *)((long)&(this->super_xr_bone).m_shape.box.halfsize.field_0 + 4) = uVar8;
  *(undefined8 *)((long)&(this->super_xr_bone).m_shape.box.rotate.field_0 + 0x20) = uVar6;
  *(undefined8 *)((long)&(this->super_xr_bone).m_shape.box.translate.field_0 + 4) = uVar7;
  *(undefined8 *)((long)&(this->super_xr_bone).m_shape.box.rotate.field_0 + 0x10) = uVar4;
  *(undefined8 *)((long)&(this->super_xr_bone).m_shape.box.rotate.field_0 + 0x18) = uVar5;
  *(undefined8 *)&(this->super_xr_bone).m_shape.box.rotate.field_0 = uVar2;
  *(undefined8 *)((long)&(this->super_xr_bone).m_shape.box.rotate.field_0 + 8) = uVar3;
  (r->field_2).m_p = (r->field_2).m_p + 0x3c;
  *(undefined8 *)&(this->super_xr_bone).m_bind_rotate.field_0 = 0;
  *(undefined8 *)((long)&(this->super_xr_bone).m_bind_rotate.field_0 + 8) = 0;
  *(undefined8 *)((long)&(this->super_xr_bone).m_bind_offset.field_0 + 4) = 0;
  (this->super_xr_bone).m_bind_length = 0.5;
  return;
}

Assistant:

inline void xr_ogf_v3::bone_io::import(xr_reader& r)
{
	r.r_sz(m_name);
	r.r_sz(m_parent_name);
	m_vmap_name = m_name;

	m_shape.type = ST_BOX;
	m_shape.flags = 0;
	r.r(m_shape.box);

	// FIXME: reconstruct bind pose here
	m_bind_offset.set();
	m_bind_rotate.set();
	m_bind_length = 0.5f;
}